

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afloader.c
# Opt level: O1

FT_Int32 af_loader_compute_darkening(AF_Loader loader,FT_Face face,FT_Pos standard_width)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  FT_Long FVar7;
  ulong uVar8;
  AF_Module a_;
  FT_Long FVar9;
  FT_Long FVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong b_;
  
  a_ = loader->globals->module;
  iVar11._0_2_ = (face->size->metrics).x_ppem;
  iVar11._2_2_ = (face->size->metrics).y_ppem;
  b_ = 0x40000;
  if (3 < (ushort)(undefined2)iVar11) {
    b_ = (ulong)(uint)(iVar11 << 0x10);
  }
  iVar1._0_2_ = face->units_per_EM;
  iVar1._2_2_ = face->ascender;
  FVar7 = FT_DivFix(0x3e80000,(ulong)(uint)(iVar1 << 0x10));
  if (FVar7 < 0x28f) {
    return 0;
  }
  if (standard_width < 1) {
    lVar12 = 0x4b0000;
  }
  else {
    lVar12 = (long)(int)FVar7 * (long)((int)standard_width << 0x10);
    lVar12 = (long)(int)((ulong)((lVar12 >> 0x3f) + lVar12 + 0x8000) >> 0x10);
  }
  iVar11 = a_->darken_params[0];
  iVar1 = a_->darken_params[6];
  iVar14 = 0x1f;
  uVar13 = (uint)lVar12;
  if (uVar13 != 0) {
    for (; uVar13 >> iVar14 == 0; iVar14 = iVar14 + -1) {
    }
  }
  iVar6 = 0x1f;
  uVar15 = (uint)b_;
  if (uVar15 != 0) {
    for (; uVar15 >> iVar6 == 0; iVar6 = iVar6 + -1) {
    }
  }
  if ((uint)(iVar6 + iVar14) < 0x2e) {
    uVar8 = (ulong)(int)((ulong)((int)uVar15 * lVar12 + ((int)uVar15 * lVar12 >> 0x3f) + 0x8000) >>
                        0x10);
  }
  else {
    uVar8 = (ulong)(uint)(iVar1 << 0x10);
  }
  iVar14 = a_->darken_params[1];
  if ((long)(ulong)(uint)(iVar11 << 0x10) <= (long)uVar8) {
    iVar6 = a_->darken_params[2];
    iVar2 = a_->darken_params[3];
    iVar3 = a_->darken_params[4];
    iVar4 = a_->darken_params[5];
    iVar5 = a_->darken_params[7];
    if ((long)uVar8 < (long)(ulong)(uint)(iVar6 << 0x10)) {
      FVar9 = FT_DivFix((ulong)(uint)(iVar11 << 0x10),b_);
      if (iVar6 - iVar11 != 0) {
        FVar9 = FT_MulDiv((long)(int)(uVar13 - (int)FVar9),(long)(iVar2 - iVar14),
                          (long)(iVar6 - iVar11));
        FVar10 = FT_DivFix((ulong)(uint)(iVar14 << 0x10),b_);
        a_ = (AF_Module)(FVar10 + FVar9);
      }
      if (iVar6 != iVar11) goto LAB_00241cbd;
LAB_00241d8e:
      FVar9 = FT_DivFix((ulong)(uint)(iVar6 << 0x10),b_);
      iVar11 = 3;
      if (iVar3 - iVar6 != 0) {
        FVar10 = FT_MulDiv((long)(int)(uVar13 - (int)FVar9),(long)(iVar4 - iVar2),
                           (long)(iVar3 - iVar6));
        FVar9 = FT_DivFix((ulong)(uint)(iVar2 << 0x10),b_);
        a_ = (AF_Module)(FVar9 + FVar10);
        iVar11 = 0;
      }
      if (iVar11 == 0) goto LAB_00241cbd;
      if (iVar11 != 3) {
        return (FT_Int32)FVar9;
      }
    }
    else {
      if ((long)uVar8 < (long)(ulong)(uint)(iVar3 << 0x10)) goto LAB_00241d8e;
      iVar14 = iVar5;
      if ((long)(ulong)(uint)(iVar1 << 0x10) <= (long)uVar8) goto LAB_00241caf;
    }
    FVar9 = FT_DivFix((ulong)(uint)(iVar3 << 0x10),b_);
    if (iVar1 - iVar3 != 0) {
      FVar9 = FT_MulDiv((long)(int)(uVar13 - (int)FVar9),(long)(iVar5 - iVar4),(long)(iVar1 - iVar3)
                       );
      FVar10 = FT_DivFix((ulong)(uint)(iVar4 << 0x10),b_);
      a_ = (AF_Module)(FVar10 + FVar9);
    }
    iVar14 = iVar5;
    if (iVar1 != iVar3) goto LAB_00241cbd;
  }
LAB_00241caf:
  a_ = (AF_Module)FT_DivFix((ulong)(uint)(iVar14 << 0x10),b_);
LAB_00241cbd:
  FVar7 = FT_DivFix((FT_Long)a_,FVar7);
  return (int)FVar7 + 0x8000 >> 0x10;
}

Assistant:

FT_LOCAL_DEF( FT_Int32 )
  af_loader_compute_darkening( AF_Loader  loader,
                               FT_Face    face,
                               FT_Pos     standard_width )
  {
    AF_Module  module = loader->globals->module;

    FT_UShort  units_per_EM;
    FT_Fixed   ppem, em_ratio;
    FT_Fixed   stem_width, stem_width_per_1000, scaled_stem, darken_amount;
    FT_Int     log_base_2;
    FT_Int     x1, y1, x2, y2, x3, y3, x4, y4;


    ppem         = FT_MAX( af_intToFixed( 4 ),
                           af_intToFixed( face->size->metrics.x_ppem ) );
    units_per_EM = face->units_per_EM;

    em_ratio = FT_DivFix( af_intToFixed( 1000 ),
                          af_intToFixed ( units_per_EM ) );
    if ( em_ratio < af_floatToFixed( .01 ) )
    {
      /* If something goes wrong, don't embolden. */
      return 0;
    }

    x1 = module->darken_params[0];
    y1 = module->darken_params[1];
    x2 = module->darken_params[2];
    y2 = module->darken_params[3];
    x3 = module->darken_params[4];
    y3 = module->darken_params[5];
    x4 = module->darken_params[6];
    y4 = module->darken_params[7];

    if ( standard_width <= 0 )
    {
      stem_width          = af_intToFixed( 75 ); /* taken from cf2font.c */
      stem_width_per_1000 = stem_width;
    }
    else
    {
      stem_width          = af_intToFixed( standard_width );
      stem_width_per_1000 = FT_MulFix( stem_width, em_ratio );
    }

    log_base_2 = FT_MSB( (FT_UInt32)stem_width_per_1000 ) +
                 FT_MSB( (FT_UInt32)ppem );

    if ( log_base_2 >= 46 )
    {
      /* possible overflow */
      scaled_stem = af_intToFixed( x4 );
    }
    else
      scaled_stem = FT_MulFix( stem_width_per_1000, ppem );

    /* now apply the darkening parameters */
    if ( scaled_stem < af_intToFixed( x1 ) )
      darken_amount = FT_DivFix( af_intToFixed( y1 ), ppem );

    else if ( scaled_stem < af_intToFixed( x2 ) )
    {
      FT_Int  xdelta = x2 - x1;
      FT_Int  ydelta = y2 - y1;
      FT_Int  x      = stem_width_per_1000 -
                       FT_DivFix( af_intToFixed( x1 ), ppem );


      if ( !xdelta )
        goto Try_x3;

      darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                      FT_DivFix( af_intToFixed( y1 ), ppem );
    }

    else if ( scaled_stem < af_intToFixed( x3 ) )
    {
    Try_x3:
      {
        FT_Int  xdelta = x3 - x2;
        FT_Int  ydelta = y3 - y2;
        FT_Int  x      = stem_width_per_1000 -
                         FT_DivFix( af_intToFixed( x2 ), ppem );


        if ( !xdelta )
          goto Try_x4;

        darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                        FT_DivFix( af_intToFixed( y2 ), ppem );
      }
    }

    else if ( scaled_stem < af_intToFixed( x4 ) )
    {
    Try_x4:
      {
        FT_Int  xdelta = x4 - x3;
        FT_Int  ydelta = y4 - y3;
        FT_Int  x      = stem_width_per_1000 -
                         FT_DivFix( af_intToFixed( x3 ), ppem );


        if ( !xdelta )
          goto Use_y4;

        darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                        FT_DivFix( af_intToFixed( y3 ), ppem );
      }
    }

    else
    {
    Use_y4:
      darken_amount = FT_DivFix( af_intToFixed( y4 ), ppem );
    }

    /* Convert darken_amount from per 1000 em to true character space. */
    return af_fixedToInt( FT_DivFix( darken_amount, em_ratio ) );
  }